

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scm_spaceship(void)

{
  cell_map local_28;
  
  scm_stop();
  if (width < 7) {
    width = 7;
  }
  if (height < 6) {
    height = 6;
  }
  cell_map::cell_map(&local_28,width,height);
  cell_map::operator=(&grid,&local_28);
  cell_map::~cell_map(&local_28);
  cell_map::set_cell(&grid,2,5);
  cell_map::set_cell(&grid,2,3);
  cell_map::set_cell(&grid,3,2);
  cell_map::set_cell(&grid,4,2);
  cell_map::set_cell(&grid,5,5);
  cell_map::set_cell(&grid,5,2);
  cell_map::set_cell(&grid,6,2);
  cell_map::set_cell(&grid,6,3);
  cell_map::set_cell(&grid,6,4);
  paint_grid();
  return;
}

Assistant:

void scm_spaceship()
  {
  scm_stop();
  if (width < 7)
    width = 7;
  if (height < 6)
    height = 6;
  grid = cell_map(width, height);

  grid.set_cell(2, 5);
  grid.set_cell(2, 3);
  grid.set_cell(3, 2);
  grid.set_cell(4, 2);
  grid.set_cell(5, 5);
  grid.set_cell(5, 2);
  grid.set_cell(6, 2);
  grid.set_cell(6, 3);
  grid.set_cell(6, 4);

  paint_grid();
  }